

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O3

void dump_colors(ang_file *fff)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  
  pcVar7 = (char *)0x2db351;
  uVar6 = 0;
  do {
    bVar1 = angband_color_table[uVar6][0];
    bVar2 = angband_color_table[uVar6][1];
    bVar3 = angband_color_table[uVar6][2];
    bVar4 = angband_color_table[uVar6][3];
    if ((((uVar6 < 0x1d) || (bVar1 != 0)) || (bVar2 != 0)) || ((bVar3 != 0 || (bVar4 != 0)))) {
      pcVar5 = "unknown";
      if (uVar6 < 0x1d) {
        pcVar5 = pcVar7;
      }
      file_putf(fff,"# Color: %s\n",pcVar5);
      file_putf(fff,"color:%d:%d:%d:%d:%d\n\n",uVar6 & 0xffffffff,(ulong)bVar1,(ulong)bVar2,
                (ulong)bVar3,(uint)bVar4);
    }
    uVar6 = uVar6 + 1;
    pcVar7 = pcVar7 + 0x2a;
  } while (uVar6 != 0x20);
  return;
}

Assistant:

void dump_colors(ang_file *fff)
{
	int i;

	for (i = 0; i < MAX_COLORS; i++) {
		int kv = angband_color_table[i][0];
		int rv = angband_color_table[i][1];
		int gv = angband_color_table[i][2];
		int bv = angband_color_table[i][3];

		const char *name = "unknown";

		/* Skip non-entries, except those in the basic colors */
		if (!kv && !rv && !gv && !bv && i >= BASIC_COLORS) continue;

		/* Extract the color name */
		if (i < BASIC_COLORS) name = color_table[i].name;

		file_putf(fff, "# Color: %s\n", name);
		file_putf(fff, "color:%d:%d:%d:%d:%d\n\n", i, kv, rv, gv, bv);
	}
}